

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# security_materials.cpp
# Opt level: O0

Error * ot::commissioner::security_material::GetNetworkSMImpl
                  (Error *__return_storage_ptr__,string *aNwkFolder,string *aAlias,bool aNeedCert,
                  bool aNeedPSKc,SecurityMaterials *aSM)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>_>
  __l;
  byte bVar1;
  bool bVar2;
  string *psVar3;
  char *pcVar4;
  Error *pEVar5;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  aVar6;
  basic_string_view<char> bVar7;
  string_view fmt;
  string_view fmt_00;
  format_args args;
  format_args args_00;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>
  *local_6b8;
  ErrorCode local_66c;
  Error local_668;
  ErrorCode local_63c;
  string local_638;
  Error local_618;
  undefined1 local_5f0 [8];
  string path_2;
  undefined1 local_5a8 [8];
  Error tokenError;
  ByteArray bytes_1;
  Error local_548;
  Error local_520;
  undefined1 local_4f8 [8];
  string path_1;
  v10 *local_4d0;
  char *local_4c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4c0;
  allocator local_499;
  string local_498;
  anon_class_1_0_00000001 local_472;
  v10 local_471;
  v10 *local_470;
  char *local_468;
  undefined1 local_460 [8];
  string out;
  Error local_418;
  undefined1 local_3f0 [8];
  ByteArray bytes;
  string local_3d0;
  Error local_3b0;
  Error local_388;
  undefined1 local_360 [8];
  string path;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>
  *element;
  iterator __end3;
  iterator __begin3;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>_>_>
  *__range3;
  ByteArray *local_318;
  ByteArray *local_310;
  ByteArray *local_308;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>
  *local_300;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>
  local_2f8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>
  local_2d0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>
  local_2a8;
  iterator local_280;
  size_type local_278;
  undefined1 local_270 [8];
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>_>_>
  smElements;
  string local_250;
  Error local_230;
  string local_208;
  string local_1d8;
  undefined1 local_1b8 [8];
  string nwkPath;
  SecurityMaterials *aSM_local;
  bool aNeedPSKc_local;
  bool aNeedCert_local;
  string *aAlias_local;
  string *aNwkFolder_local;
  Error *error;
  undefined1 local_158 [16];
  v10 *local_148;
  char *local_140;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_138;
  v10 *local_130;
  char *pcStack_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_120;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_118 [3];
  undefined1 local_100 [16];
  v10 *local_f0;
  char *local_e8;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_e0;
  v10 *local_d8;
  char *pcStack_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_c8;
  v10 *local_c0;
  v10 **local_b8;
  v10 *local_b0;
  v10 **local_a8;
  v10 **local_a0;
  v10 *local_98;
  char *pcStack_90;
  v10 **local_80;
  v10 *local_78;
  char *pcStack_70;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_68;
  undefined1 *local_60;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_58;
  undefined8 local_50;
  undefined1 *local_48;
  Error **local_40;
  undefined1 *local_38;
  Error **local_30;
  undefined8 local_28;
  undefined1 *local_20;
  Error **local_18;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_10;
  
  nwkPath.field_2._M_local_buf[0xf] = '\0';
  aVar6 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
           )aSM;
  Error::Error(__return_storage_ptr__);
  std::__cxx11::string::string((string *)local_1b8);
  SMRoot::Get_abi_cxx11_(&local_1d8,(SMRoot *)smRoot);
  bVar1 = std::__cxx11::string::empty();
  std::__cxx11::string::~string((string *)&local_1d8);
  if ((bVar1 & 1) == 0) {
    SMRoot::Get_abi_cxx11_(&local_208,(SMRoot *)smRoot);
    psVar3 = (string *)std::__cxx11::string::append((string *)&local_208);
    pcVar4 = (char *)std::__cxx11::string::append(psVar3);
    psVar3 = (string *)std::__cxx11::string::append(pcVar4);
    std::__cxx11::string::operator=((string *)local_1b8,psVar3);
    std::__cxx11::string::~string((string *)&local_208);
    std::__cxx11::string::string((string *)&local_250,(string *)local_1b8);
    PathExists(&local_230,&local_250);
    pEVar5 = Error::operator=(__return_storage_ptr__,&local_230);
    smElements.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
    bVar2 = commissioner::operator!=
                      (pEVar5,(ErrorCode *)
                              ((long)&smElements.
                                      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
    Error::~Error(&local_230);
    std::__cxx11::string::~string((string *)&local_250);
    if (!bVar2) {
      if (aNeedCert) {
        local_300 = &local_2f8;
        local_308 = &aSM->mCertificate;
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>
        ::
        pair<const_char_(&)[9],_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_true>
                  (local_300,(char (*) [9])0x39f3b1,&local_308);
        local_300 = &local_2d0;
        local_310 = &aSM->mPrivateKey;
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>
        ::
        pair<const_char_(&)[9],_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_true>
                  (local_300,(char (*) [9])0x39f351,&local_310);
        local_300 = &local_2a8;
        local_318 = &aSM->mTrustAnchor;
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>
        ::
        pair<const_char_(&)[7],_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_true>
                  (local_300,(char (*) [7])0x39f2f3,&local_318);
        local_280 = &local_2f8;
        local_278 = 3;
        std::
        allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>_>
        ::allocator((allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>_>
                     *)((long)&__range3 + 7));
        __l._M_len = local_278;
        __l._M_array = local_280;
        std::
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>_>_>
        ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>_>_>
                  *)local_270,__l,
                 (allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>_>
                  *)((long)&__range3 + 7));
        std::
        allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>_>
        ::~allocator((allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>_>
                      *)((long)&__range3 + 7));
        local_6b8 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>
                     *)&local_280;
        do {
          local_6b8 = local_6b8 + -1;
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>
          ::~pair(local_6b8);
        } while (local_6b8 != &local_2f8);
        __end3 = std::
                 vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>_>_>
                 ::begin((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>_>_>
                          *)local_270);
        element = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>
                   *)std::
                     vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>_>_>
                     ::end((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>_>_>
                            *)local_270);
        while (bVar2 = __gnu_cxx::operator!=
                                 (&__end3,(__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>_>_>_>
                                           *)&element), bVar2) {
          path.field_2._8_8_ =
               __gnu_cxx::
               __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>_>_>_>
               ::operator*(&__end3);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_360,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_1b8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         path.field_2._8_8_);
          Error::Error(&local_388);
          std::__cxx11::string::string((string *)&local_3d0,(string *)local_360);
          PathExists(&local_3b0,&local_3d0);
          bVar2 = Error::operator!=(&local_388,&local_3b0);
          Error::~Error(&local_3b0);
          std::__cxx11::string::~string((string *)&local_3d0);
          Error::~Error(&local_388);
          if (bVar2) {
            bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._4_4_ = 8;
          }
          else {
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_3f0);
            ReadPemFile(&local_418,
                        (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_3f0,
                        (string *)local_360);
            Error::operator=(__return_storage_ptr__,&local_418);
            Error::~Error(&local_418);
            Error::Error((Error *)((long)&out.field_2 + 8));
            pEVar5 = (Error *)((long)&out.field_2 + 8);
            bVar2 = Error::operator!=(__return_storage_ptr__,pEVar5);
            Error::~Error((Error *)((long)&out.field_2 + 8));
            if (bVar2) {
              if ((gVerbose & 1) == 0) {
                std::allocator<char>::allocator();
                pcVar4 = "security-materials";
                std::__cxx11::string::string((string *)&local_498,"security-materials",&local_499);
                GetNetworkSMImpl::anon_class_1_0_00000001::operator()
                          ((anon_class_1_0_00000001 *)(path_1.field_2._M_local_buf + 0xe));
                local_a8 = &local_4d0;
                local_b0 = (v10 *)(path_1.field_2._M_local_buf + 0xf);
                bVar7 = ::fmt::v10::operator()(local_b0);
                local_4c8 = (char *)bVar7.size_;
                local_4d0 = (v10 *)bVar7.data_;
                ::fmt::v10::detail::
                check_format_string<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_FMT_COMPILE_STRING,_0>
                          ();
                local_120 = &local_4c0;
                local_130 = local_4d0;
                pcStack_128 = local_4c8;
                local_138 = (format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)local_360;
                local_80 = &local_130;
                local_148 = local_4d0;
                local_140 = local_4c8;
                local_78 = local_148;
                pcStack_70 = local_140;
                error = (Error *)::fmt::v10::
                                 make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,std::__cxx11::string>
                                           (local_138,(v10 *)pcVar4,local_120);
                local_38 = local_158;
                local_40 = &error;
                local_28 = 0xd;
                fmt_00.size_ = 0xd;
                fmt_00.data_ = local_140;
                args_00.field_1.values_ = aVar6.values_;
                args_00.desc_ = (unsigned_long_long)local_40;
                local_30 = local_40;
                local_20 = local_38;
                local_18 = local_40;
                ::fmt::v10::vformat_abi_cxx11_(&local_4c0,local_148,fmt_00,args_00);
                Log(kError,&local_498,&local_4c0);
                std::__cxx11::string::~string((string *)&local_4c0);
                std::__cxx11::string::~string((string *)&local_498);
                std::allocator<char>::~allocator((allocator<char> *)&local_499);
              }
              else {
                GetNetworkSMImpl::anon_class_1_0_00000001::operator()(&local_472);
                local_b8 = &local_470;
                local_c0 = &local_471;
                bVar7 = ::fmt::v10::operator()(local_c0);
                local_468 = (char *)bVar7.size_;
                local_470 = (v10 *)bVar7.data_;
                ::fmt::v10::detail::
                check_format_string<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_FMT_COMPILE_STRING,_0>
                          ();
                local_c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_460;
                local_d8 = local_470;
                pcStack_d0 = local_468;
                local_e0 = (format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)local_360;
                local_a0 = &local_d8;
                local_f0 = local_470;
                local_e8 = local_468;
                local_98 = local_f0;
                pcStack_90 = local_e8;
                local_118[0] = ::fmt::v10::
                               make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,std::__cxx11::string>
                                         (local_e0,(v10 *)pEVar5,local_c8);
                local_60 = local_100;
                local_68 = local_118;
                local_50 = 0xd;
                fmt.size_ = 0xd;
                fmt.data_ = local_e8;
                args.field_1.values_ = aVar6.values_;
                args.desc_ = (unsigned_long_long)local_68;
                local_58 = local_68;
                local_48 = local_60;
                local_10 = local_68;
                ::fmt::v10::vformat_abi_cxx11_((string *)local_460,local_f0,fmt,args);
                Console::Write((string *)local_460,kRed);
                std::__cxx11::string::~string((string *)local_460);
              }
            }
            else {
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                        (*(vector<unsigned_char,_std::allocator<unsigned_char>_> **)
                          (path.field_2._8_8_ + 0x20),
                         (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_3f0);
            }
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_3f0);
            bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
          }
          std::__cxx11::string::~string((string *)local_360);
          __gnu_cxx::
          __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>_>_>_>
          ::operator++(&__end3);
        }
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_4f8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1b8,"tok.cbor");
        Error::Error(&local_520);
        std::__cxx11::string::string
                  ((string *)
                   &bytes_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,(string *)local_4f8);
        PathExists(&local_548,
                   (string *)
                   &bytes_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage);
        bVar2 = Error::operator!=(&local_520,&local_548);
        Error::~Error(&local_548);
        std::__cxx11::string::~string
                  ((string *)
                   &bytes_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage);
        Error::~Error(&local_520);
        if (bVar2) {
          bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_4_ = 0xb;
        }
        else {
          this = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 ((long)&tokenError.mMessage.field_2 + 8);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(this);
          ReadHexStringFile((Error *)local_5a8,this,(string *)local_4f8);
          Error::Error((Error *)((long)&path_2.field_2 + 8));
          bVar2 = Error::operator==((Error *)((long)&path_2.field_2 + 8),(Error *)local_5a8);
          Error::~Error((Error *)((long)&path_2.field_2 + 8));
          if (bVar2) {
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                      (&aSM->mCommissionerToken,
                       (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       ((long)&tokenError.mMessage.field_2 + 8));
          }
          Error::~Error((Error *)local_5a8);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     ((long)&tokenError.mMessage.field_2 + 8));
          bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
        }
        std::__cxx11::string::~string((string *)local_4f8);
        std::
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>_>_>
        ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>_>_>
                   *)local_270);
      }
      if (aNeedPSKc) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_5f0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1b8,"pskc.txt");
        std::__cxx11::string::string((string *)&local_638,(string *)local_5f0);
        PathExists(&local_618,&local_638);
        pEVar5 = Error::operator=(__return_storage_ptr__,&local_618);
        local_63c = kNone;
        bVar2 = commissioner::operator!=(pEVar5,&local_63c);
        Error::~Error(&local_618);
        std::__cxx11::string::~string((string *)&local_638);
        if (bVar2) {
          bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_4_ = 4;
        }
        else {
          ReadHexStringFile(&local_668,&aSM->mPSKc,(string *)local_5f0);
          pEVar5 = Error::operator=(__return_storage_ptr__,&local_668);
          local_66c = kNone;
          bVar2 = commissioner::operator!=(pEVar5,&local_66c);
          Error::~Error(&local_668);
          if (bVar2) {
            bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._4_4_ = 4;
          }
          else {
            bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
          }
        }
        std::__cxx11::string::~string((string *)local_5f0);
        if ((bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage._4_4_ != 0) &&
           (bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._4_4_ != 4)) goto LAB_002f9dd6;
      }
    }
  }
  nwkPath.field_2._M_local_buf[0xf] = '\x01';
  bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
LAB_002f9dd6:
  std::__cxx11::string::~string((string *)local_1b8);
  if ((nwkPath.field_2._M_local_buf[0xf] & 1U) == 0) {
    Error::~Error(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

static Error GetNetworkSMImpl(const std::string &aNwkFolder,
                              const std::string &aAlias,
                              bool               aNeedCert,
                              bool               aNeedPSKc,
                              SecurityMaterials &aSM)
{
    Error       error;
    std::string nwkPath;

    // If SM root is unset, do nothing
    VerifyOrExit(!smRoot.Get().empty());

    nwkPath = smRoot.Get().append(aNwkFolder).append(aAlias).append("/");
    SuccessOrExit(error = PathExists(nwkPath));
    if (aNeedCert)
    {
        std::vector<SMPair> smElements{
            {"cert.pem", &aSM.mCertificate}, {"priv.pem", &aSM.mPrivateKey}, {"ca.pem", &aSM.mTrustAnchor}};

        for (const auto &element : smElements)
        {
            std::string path = nwkPath + element.first;
            if (ERROR_NONE != PathExists(path))
            {
                continue;
            }
            ByteArray bytes;
            error = ReadPemFile(bytes, path);
            if (error != ERROR_NONE)
            {
                if (gVerbose)
                {
                    std::string out = fmt::format(FMT_STRING(SM_ERROR_MESSAGE_PEM_READ_FAILED), path);
                    Console::Write(out, Console::Color::kRed);
                }
                else
                {
                    LOG_ERROR(LOG_REGION_SECURITY_MATERIALS, SM_ERROR_MESSAGE_PEM_READ_FAILED, path);
                }
            }
            else
            {
                *element.second = bytes;
            }
        }

        do
        {
            std::string path = nwkPath + "tok.cbor";
            if (ERROR_NONE != PathExists(path))
            {
                break;
            }
            ByteArray bytes;
            Error     tokenError = ReadHexStringFile(bytes, path);
            if (ERROR_NONE == tokenError)
            {
                aSM.mCommissionerToken = bytes;
            }
        } while (false);
    }
    if (aNeedPSKc)
    {
        std::string path = nwkPath + "pskc.txt";

        SuccessOrExit(error = PathExists(path));
        SuccessOrExit(error = ReadHexStringFile(aSM.mPSKc, path));
    }
exit:
    return error;
}